

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::GLMClassifier_DoubleArray::InternalSwap
          (GLMClassifier_DoubleArray *this,GLMClassifier_DoubleArray *other)

{
  GLMClassifier_DoubleArray *other_local;
  GLMClassifier_DoubleArray *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->value_,&other->value_);
  return;
}

Assistant:

void GLMClassifier_DoubleArray::InternalSwap(GLMClassifier_DoubleArray* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  value_.InternalSwap(&other->value_);
}